

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxSelf::Emit(FxSelf *this,VMFunctionBuilder *build)

{
  VMFunctionBuilder *build_local;
  FxSelf *this_local;
  
  if ((this->check & 1U) != 0) {
    VMFunctionBuilder::Emit(build,0xcf,1,0,1);
    VMFunctionBuilder::Emit(build,0x44,1);
    VMFunctionBuilder::Emit(build,0x52,2,5);
  }
  ExpEmit::ExpEmit((ExpEmit *)&this_local,0,3,false,true);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxSelf::Emit(VMFunctionBuilder *build)
{
	if (check)
	{
		build->Emit(OP_EQA_R, 1, 0, 1);
		build->Emit(OP_JMP, 1);
		build->Emit(OP_THROW, 2, X_BAD_SELF);
	}
	// self is always the first pointer passed to the function
	return ExpEmit(0, REGT_POINTER, false, true);
}